

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall FDrawInfo::FloodUpperGap(FDrawInfo *this,seg_t *seg)

{
  bool bVar1;
  float planez;
  double dVar2;
  FTextureID local_534;
  double local_530;
  double frontz;
  double backz;
  vertex_t *v2;
  vertex_t *v1;
  sector_t *fakebsector;
  sector_t *fakefsector;
  sector_t bfake;
  sector_t ffake;
  wallseg ws;
  seg_t *seg_local;
  FDrawInfo *this_local;
  
  sector_t::sector_t((sector_t *)bfake.vbocount);
  sector_t::sector_t((sector_t *)&fakefsector);
  fakebsector = gl_FakeFlat(seg->frontsector,(sector_t *)bfake.vbocount,true);
  v1 = (vertex_t *)gl_FakeFlat(seg->backsector,(sector_t *)&fakefsector,false);
  frontz = secplane_t::ZatPoint(&((sector_t *)v1)->ceilingplane,seg->v1);
  local_530 = secplane_t::ZatPoint(&fakebsector->ceilingplane,seg->v1);
  local_534 = sector_t::GetTexture((sector_t *)v1,1);
  bVar1 = FTextureID::operator==(&local_534,&skyflatnum);
  if ((!bVar1) && (ViewPos.Z <= frontz)) {
    if (seg->sidedef == seg->linedef->sidedef[0]) {
      v2 = seg->linedef->v1;
      backz = (double)seg->linedef->v2;
    }
    else {
      v2 = seg->linedef->v2;
      backz = (double)seg->linedef->v1;
    }
    dVar2 = vertex_t::fX(v2);
    ffake.vbocount[0] = (int)(float)dVar2;
    dVar2 = vertex_t::fY(v2);
    ffake.vbocount[1] = (int)(float)dVar2;
    vertex_t::fX((vertex_t *)backz);
    vertex_t::fY((vertex_t *)backz);
    planez = (float)frontz;
    SetupFloodStencil(this,(wallseg *)ffake.vbocount);
    DrawFloodedPlane(this,(wallseg *)ffake.vbocount,planez,(sector_t *)v1,true);
    ClearFloodStencil(this,(wallseg *)ffake.vbocount);
  }
  return;
}

Assistant:

void FDrawInfo::FloodUpperGap(seg_t * seg)
{
	wallseg ws;
	sector_t ffake, bfake;
	sector_t * fakefsector = gl_FakeFlat(seg->frontsector, &ffake, true);
	sector_t * fakebsector = gl_FakeFlat(seg->backsector, &bfake, false);

	vertex_t * v1, * v2;

	// Although the plane can be sloped this code will only be called
	// when the edge itself is not.
	double backz = fakebsector->ceilingplane.ZatPoint(seg->v1);
	double frontz = fakefsector->ceilingplane.ZatPoint(seg->v1);

	if (fakebsector->GetTexture(sector_t::ceiling)==skyflatnum) return;
	if (backz < ViewPos.Z) return;

	if (seg->sidedef == seg->linedef->sidedef[0])
	{
		v1=seg->linedef->v1;
		v2=seg->linedef->v2;
	}
	else
	{
		v1=seg->linedef->v2;
		v2=seg->linedef->v1;
	}

	ws.x1 = v1->fX();
	ws.y1 = v1->fY();
	ws.x2 = v2->fX();
	ws.y2 = v2->fY();

	ws.z1= frontz;
	ws.z2= backz;

	// Step1: Draw a stencil into the gap
	SetupFloodStencil(&ws);

	// Step2: Project the ceiling plane into the gap
	DrawFloodedPlane(&ws, ws.z2, fakebsector, true);

	// Step3: Delete the stencil
	ClearFloodStencil(&ws);
}